

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O3

CPT * __thiscall despot::HierarchyCPT::CreateNoisyVariant(HierarchyCPT *this,double noise)

{
  NamedVar *child;
  int iVar1;
  HierarchyCPT *this_00;
  pointer ppTVar2;
  undefined4 extraout_var;
  ulong uVar3;
  vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> local_30;
  
  this_00 = (HierarchyCPT *)operator_new(0x70);
  child = (this->super_CPT).super_Function.child_;
  std::vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>::vector
            (&local_30,&(this->super_CPT).super_Function.parents_);
  HierarchyCPT(this_00,child,&local_30);
  if (local_30.super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30.
                    super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_30.
                          super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_30.
                          super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  ppTVar2 = (this->cpts_).
            super__Vector_base<despot::TabularCPT_*,_std::allocator<despot::TabularCPT_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->cpts_).super__Vector_base<despot::TabularCPT_*,_std::allocator<despot::TabularCPT_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppTVar2) {
    uVar3 = 0;
    do {
      iVar1 = (*(ppTVar2[uVar3]->super_CPT).super_Function._vptr_Function[0x11])(noise);
      (this_00->cpts_).
      super__Vector_base<despot::TabularCPT_*,_std::allocator<despot::TabularCPT_*>_>._M_impl.
      super__Vector_impl_data._M_start[uVar3] = (TabularCPT *)CONCAT44(extraout_var,iVar1);
      uVar3 = uVar3 + 1;
      ppTVar2 = (this->cpts_).
                super__Vector_base<despot::TabularCPT_*,_std::allocator<despot::TabularCPT_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
    } while (uVar3 < (ulong)((long)(this->cpts_).
                                   super__Vector_base<despot::TabularCPT_*,_std::allocator<despot::TabularCPT_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar2 >> 3))
    ;
  }
  return &this_00->super_CPT;
}

Assistant:

CPT* HierarchyCPT::CreateNoisyVariant(double noise) const {
	HierarchyCPT* hcpt = new HierarchyCPT(child_, parents_);
	for (int i = 0; i < cpts_.size(); i++)
		hcpt->cpts_[i] = static_cast<TabularCPT*>(cpts_[i]->CreateNoisyVariant(
			noise));
	return hcpt;
}